

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O0

void Rwt_ListAddToTail(Rwt_Node_t **ppList,Rwt_Node_t *pNode)

{
  Rwt_Node_t *local_20;
  Rwt_Node_t *pTemp;
  Rwt_Node_t *pNode_local;
  Rwt_Node_t **ppList_local;
  
  pNode_local = (Rwt_Node_t *)ppList;
  for (local_20 = *ppList; local_20 != (Rwt_Node_t *)0x0; local_20 = local_20->pNext) {
    pNode_local = (Rwt_Node_t *)&local_20->pNext;
  }
  *(Rwt_Node_t **)pNode_local = pNode;
  return;
}

Assistant:

void Rwt_ListAddToTail( Rwt_Node_t ** ppList, Rwt_Node_t * pNode )
{
    Rwt_Node_t * pTemp;
    // find the last one
    for ( pTemp = *ppList; pTemp; pTemp = pTemp->pNext )
        ppList = &pTemp->pNext;
    // attach at the end
    *ppList = pNode;
}